

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

Snapshot * __thiscall cmState::CreateBaseSnapshot(Snapshot *__return_storage_ptr__,cmState *this)

{
  PointerType pSVar1;
  iterator iVar2;
  iterator iVar3;
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> *local_50;
  PositionType local_48;
  cmLinkedTree<cmState::SnapshotDataType> *local_40;
  PositionType local_38;
  undefined1 local_20 [8];
  PositionType pos;
  cmState *this_local;
  
  pos.Position = (PositionType)this;
  iVar2 = cmLinkedTree<cmState::SnapshotDataType>::Root(&this->SnapshotData);
  _local_20 = cmLinkedTree<cmState::SnapshotDataType>::Extend(&this->SnapshotData,iVar2);
  iVar2 = cmLinkedTree<cmState::SnapshotDataType>::Root(&this->SnapshotData);
  pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  local_40 = iVar2.Tree;
  (pSVar1->DirectoryParent).Tree = local_40;
  local_38 = iVar2.Position;
  (pSVar1->DirectoryParent).Position = local_38;
  pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  pSVar1->SnapshotType = BuildsystemDirectoryType;
  iVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Root(&this->BuildsystemDirectory);
  iVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Extend
                    (&this->BuildsystemDirectory,iVar3);
  pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  local_50 = iVar3.Tree;
  (pSVar1->BuildSystemDirectory).Tree = local_50;
  local_48 = iVar3.Position;
  (pSVar1->BuildSystemDirectory).Position = local_48;
  Snapshot::Snapshot(__return_storage_ptr__,this,_local_20);
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot cmState::CreateBaseSnapshot()
{
  PositionType pos = this->SnapshotData.Extend(this->SnapshotData.Root());
  pos->DirectoryParent = this->SnapshotData.Root();
  pos->SnapshotType = BuildsystemDirectoryType;
  pos->BuildSystemDirectory =
      this->BuildsystemDirectory.Extend(this->BuildsystemDirectory.Root());
  return cmState::Snapshot(this, pos);
}